

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

void __thiscall
duckdb::Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::BoundOrderByNode,true>>
          (Deserializer *this,field_id_t field_id,char *tag,
          vector<duckdb::BoundOrderByNode,_true> *ret)

{
  ulong uVar1;
  undefined8 in_RDX;
  undefined2 in_SI;
  vector<duckdb::BoundOrderByNode,_true> *in_RDI;
  Deserializer *in_stack_00000008;
  vector<duckdb::BoundOrderByNode,_true> *in_stack_ffffffffffffffb0;
  
  uVar1 = (*(code *)(in_RDI->
                    super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                    ).
                    super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].expression.
                    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                    _M_t)(in_RDI,in_SI,in_RDX,in_SI);
  if ((uVar1 & 1) == 0) {
    SerializationDefaultValue::GetDefault<duckdb::vector<duckdb::BoundOrderByNode,true>>();
    vector<duckdb::BoundOrderByNode,_true>::operator=(in_stack_ffffffffffffffb0,in_RDI);
    vector<duckdb::BoundOrderByNode,_true>::~vector
              ((vector<duckdb::BoundOrderByNode,_true> *)0xafdc6e);
    (*(code *)(in_RDI->
              super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
              super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
              ._M_impl.super__Vector_impl_data._M_start[1].stats.
              super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
              ._M_t)(in_RDI,0);
  }
  else {
    Read<duckdb::vector<duckdb::BoundOrderByNode,true>>(in_stack_00000008);
    vector<duckdb::BoundOrderByNode,_true>::operator=(in_stack_ffffffffffffffb0,in_RDI);
    vector<duckdb::BoundOrderByNode,_true>::~vector
              ((vector<duckdb::BoundOrderByNode,_true> *)0xafdca3);
    (*(code *)(in_RDI->
              super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
              super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
              ._M_impl.super__Vector_impl_data._M_start[1].stats.
              super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
              ._M_t)(in_RDI,1);
  }
  return;
}

Assistant:

inline void ReadPropertyWithDefault(const field_id_t field_id, const char *tag, T &ret) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			ret = std::forward<T>(SerializationDefaultValue::GetDefault<T>());
			OnOptionalPropertyEnd(false);
			return;
		}
		ret = Read<T>();
		OnOptionalPropertyEnd(true);
	}